

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError EncodePalette(VP8LBitWriter *bw,int low_effort,VP8LEncoder *enc)

{
  int iVar1;
  uint32_t uVar2;
  WebPEncodingError WVar3;
  uint32_t *puVar4;
  long in_RDX;
  uint32_t *palette;
  int palette_size;
  uint32_t tmp_palette [256];
  int i;
  int in_stack_fffffffffffffbb8;
  uint32_t in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  uint32_t local_428 [48];
  int in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  VP8LBackwardRefs *in_stack_fffffffffffffca0;
  VP8LHashChain *in_stack_fffffffffffffca8;
  uint32_t *in_stack_fffffffffffffcb0;
  VP8LBitWriter *in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd8;
  int local_1c;
  
  iVar1 = *(int *)(in_RDX + 0x60);
  puVar4 = (uint32_t *)(in_RDX + 100);
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
              in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8);
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
              in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8);
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
              in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8);
  while (local_1c = iVar1 + -1, 0 < local_1c) {
    uVar2 = VP8LSubPixels(puVar4[local_1c],puVar4[iVar1 + -2]);
    local_428[local_1c] = uVar2;
    iVar1 = local_1c;
  }
  local_428[0] = *puVar4;
  WVar3 = EncodeImageNoHuffman
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,
                     in_stack_fffffffffffffcd0,in_stack_fffffffffffffcd8);
  return WVar3;
}

Assistant:

static WebPEncodingError EncodePalette(VP8LBitWriter* const bw, int low_effort,
                                       VP8LEncoder* const enc) {
  int i;
  uint32_t tmp_palette[MAX_PALETTE_SIZE];
  const int palette_size = enc->palette_size_;
  const uint32_t* const palette = enc->palette_;
  VP8LPutBits(bw, TRANSFORM_PRESENT, 1);
  VP8LPutBits(bw, COLOR_INDEXING_TRANSFORM, 2);
  assert(palette_size >= 1 && palette_size <= MAX_PALETTE_SIZE);
  VP8LPutBits(bw, palette_size - 1, 8);
  for (i = palette_size - 1; i >= 1; --i) {
    tmp_palette[i] = VP8LSubPixels(palette[i], palette[i - 1]);
  }
  tmp_palette[0] = palette[0];
  return EncodeImageNoHuffman(bw, tmp_palette, &enc->hash_chain_,
                              &enc->refs_[0], palette_size, 1, /*quality=*/20,
                              low_effort);
}